

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void exprAnalyze(SrcList *pSrc,WhereClause *pWC,int idxTerm)

{
  u32 *puVar1;
  WhereMaskSet *pMaskSet;
  byte *pbVar2;
  Bitmask *pBVar3;
  undefined2 uVar4;
  WhereInfo *pWVar5;
  Parse *pParse;
  sqlite3 *db;
  sqlite3 *pIn;
  Parse *pParse_00;
  undefined8 *puVar6;
  Vdbe *pVVar7;
  code *pcVar8;
  WhereTerm *pWVar9;
  bool bVar10;
  char cVar11;
  byte bVar12;
  char cVar13;
  short sVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  Bitmask BVar19;
  Bitmask BVar20;
  sqlite3_vfs *psVar21;
  sqlite3 *psVar22;
  CollSeq *pCVar23;
  FuncDef *pFVar24;
  WhereOrInfo *pWC_00;
  sqlite3_value *pVal;
  WhereOrInfo *pWC_01;
  Expr *pEVar25;
  byte *pbVar26;
  size_t sVar27;
  Expr *pEVar28;
  ExprList *pEVar29;
  ulong uVar30;
  Expr *pEVar31;
  Select *pSVar32;
  Op *pOVar33;
  byte bVar34;
  ushort uVar35;
  ExprList_item *pEVar36;
  long lVar37;
  long lVar38;
  byte extraout_DL;
  u8 uVar39;
  ushort uVar40;
  uint uVar41;
  int iVar42;
  char *pcVar43;
  WhereTerm *pWVar44;
  SrcList *pSVar45;
  SrcList *pSVar46;
  WhereTerm *pWVar47;
  ulong uVar48;
  short sVar49;
  Btree **ppBVar50;
  u8 uVar51;
  Expr *pLeft;
  sqlite3 *psVar52;
  SrcList *p;
  bool bVar53;
  bool bVar54;
  int aiCurCol [2];
  ulong local_c8;
  sqlite3_vfs *local_b0;
  Token local_58;
  Expr *local_48;
  ulong local_40;
  undefined1 local_38 [8];
  
  pWVar5 = pWC->pWInfo;
  pParse = pWVar5->pParse;
  db = pParse->db;
  if (db->mallocFailed != '\0') {
    return;
  }
  psVar22 = (sqlite3 *)(ulong)(uint)idxTerm;
  pWVar44 = pWC->a;
  pMaskSet = &pWVar5->sMaskSet;
  pIn = (sqlite3 *)pWVar44[idxTerm].pExpr;
  if ((Expr *)pIn->pDfltColl == (Expr *)0x0) {
    BVar19 = 0;
  }
  else {
    BVar19 = sqlite3WhereExprUsageNN(pMaskSet,(Expr *)pIn->pDfltColl);
  }
  pWVar44 = pWVar44 + idxTerm;
  bVar12 = *(byte *)&pIn->pVfs;
  if (bVar12 == 0x32) {
    pWVar44->prereqRight = 0;
  }
  else if (bVar12 == 0x31) {
    iVar15 = sqlite3ExprCheckIN(pParse,(Expr *)pIn);
    if (iVar15 != 0) {
      return;
    }
    if (((ulong)pIn->pVfs & 0x80000000000) == 0) {
      BVar20 = sqlite3WhereExprListUsage
                         (pMaskSet,((anon_union_8_2_a01b6dbf_for_x *)&pIn->aDb)->pList);
    }
    else {
      BVar20 = exprSelectUsage(pMaskSet,(Select *)
                                        ((anon_union_8_2_a01b6dbf_for_x *)&pIn->aDb)->pList);
    }
    pWVar44->prereqRight = BVar20;
  }
  else {
    if ((Expr *)pIn->mutex == (Expr *)0x0) {
      BVar20 = 0;
    }
    else {
      BVar20 = sqlite3WhereExprUsageNN(pMaskSet,(Expr *)pIn->mutex);
    }
    pWVar44->prereqRight = BVar20;
  }
  pMaskSet->bVarSelect = 0;
  psVar21 = (sqlite3_vfs *)sqlite3WhereExprUsageNN(pMaskSet,(Expr *)pIn);
  if (pMaskSet->bVarSelect != 0) {
    pbVar26 = (byte *)((long)&pWVar44->wtFlags + 1);
    *pbVar26 = *pbVar26 | 0x10;
  }
  if (((ulong)pIn->pVfs & 0x100000000) == 0) {
    local_40 = 0;
  }
  else {
    lVar38 = (long)(pWVar5->sMaskSet).n;
    if (lVar38 < 1) {
      local_40 = 0;
    }
    else {
      lVar37 = 0;
      do {
        if ((pWVar5->sMaskSet).ix[lVar37] == (int)*(i16 *)((long)&pIn->flags + 4)) {
          local_40 = 1L << ((byte)lVar37 & 0x3f);
          goto LAB_001827b9;
        }
        lVar37 = lVar37 + 1;
      } while (lVar38 != lVar37);
      local_40 = 0;
    }
LAB_001827b9:
    psVar21 = (sqlite3_vfs *)((ulong)psVar21 | local_40);
    if (local_40 <= (ulong)psVar21 >> 1) {
      sqlite3ErrorMsg(pParse,"ON clause references tables to its right");
      return;
    }
    local_40 = local_40 - 1;
  }
  pWVar44->prereqAll = (Bitmask)psVar21;
  pWVar44->iParent = -1;
  pWVar44->leftCursor = -1;
  pWVar44->eOperator = 0;
  if ((bVar12 < 0x3a) && ((0x3e6200000000000U >> ((ulong)bVar12 & 0x3f) & 1) != 0)) {
    pEVar25 = (Expr *)pIn->pDfltColl;
    while ((pEVar25 != (Expr *)0x0 && ((pEVar25->flags >> 0xc & 1) != 0))) {
      if ((pEVar25->flags >> 0x12 & 1) == 0) {
        pEVar36 = (ExprList_item *)&pEVar25->pLeft;
      }
      else {
        pEVar36 = ((pEVar25->x).pList)->a;
      }
      pEVar25 = pEVar36->pExpr;
    }
    psVar22 = (sqlite3 *)pIn->mutex;
    while ((psVar22 != (sqlite3 *)0x0 &&
           (uVar41 = *(uint *)((long)&psVar22->pVfs + 4), (uVar41 >> 0xc & 1) != 0))) {
      if ((uVar41 >> 0x12 & 1) == 0) {
        ppBVar50 = (Btree **)&psVar22->pDfltColl;
      }
      else {
        ppBVar50 = &psVar22->aDb->pBt;
      }
      psVar22 = (sqlite3 *)*ppBVar50;
    }
    uVar40 = 0x800;
    if ((pWVar44->prereqRight & BVar19) == 0) {
      uVar40 = 0x1fff;
    }
    if (0 < pWVar44->iField) {
      pEVar25 = ((pEVar25->x).pList)->a[pWVar44->iField - 1].pExpr;
    }
    iVar15 = exprMightBeIndexed(pSrc,BVar19,(int *)&local_58,pEVar25,(uint)bVar12);
    uVar41 = (uint)bVar12;
    if (iVar15 != 0) {
      pWVar44->leftCursor = (int)local_58.z;
      (pWVar44->u).leftColumn = local_58.z._4_4_;
      if (uVar41 == 0x2d) {
        uVar35 = 0x80;
      }
      else if (uVar41 == 0x31) {
        uVar35 = 1;
      }
      else if (uVar41 == 0x32) {
        uVar35 = 0x100;
      }
      else {
        uVar35 = (ushort)(2 << (bVar12 - 0x35 & 0x1f));
      }
      pWVar44->eOperator = uVar40 & uVar35;
    }
    if (uVar41 == 0x2d) {
      pbVar26 = (byte *)((long)&pWVar44->wtFlags + 1);
      *pbVar26 = *pbVar26 | 8;
    }
    bVar54 = true;
    if (psVar22 != (sqlite3 *)0x0) {
      iVar15 = exprMightBeIndexed(pSrc,pWVar44->prereqRight,(int *)&local_58,(Expr *)psVar22,uVar41)
      ;
      if (iVar15 != 0) {
        pWVar47 = pWVar44;
        if (pWVar44->leftCursor < 0) {
          sVar49 = 0;
          psVar22 = pIn;
        }
        else {
          if (pIn == (sqlite3 *)0x0) {
            psVar22 = (sqlite3 *)0x0;
          }
          else {
            psVar22 = (sqlite3 *)exprDup(db,(Expr *)pIn,0,(u8 **)0x0);
          }
          if (db->mallocFailed == '\0') {
            iVar15 = whereClauseInsert(pWC,(Expr *)psVar22,3);
            if (iVar15 == 0) goto LAB_00182b6e;
            pWVar44 = pWC->a;
            pWVar47 = pWVar44 + iVar15;
            pWVar44[iVar15].iParent = idxTerm;
            pWVar44[iVar15].truthProb = pWVar44[idxTerm].truthProb;
            pWVar44[idxTerm].nChild = pWVar44[idxTerm].nChild + '\x01';
            if (bVar12 == 0x2d) {
              pbVar26 = (byte *)((long)&pWVar47->wtFlags + 1);
              *pbVar26 = *pbVar26 | 8;
            }
            *(byte *)&pWVar44[idxTerm].wtFlags = (byte)pWVar44[idxTerm].wtFlags | 8;
            pWVar44 = pWVar44 + idxTerm;
            iVar15 = termIsEquivalence(pParse,(Expr *)psVar22);
            bVar54 = true;
            if (iVar15 == 0) {
              sVar49 = 0;
            }
            else {
              pbVar26 = (byte *)((long)&pWVar44->eOperator + 1);
              *pbVar26 = *pbVar26 | 8;
              sVar49 = 0x800;
            }
          }
          else {
            if (psVar22 != (sqlite3 *)0x0) {
              sqlite3ExprDeleteNN(db,(Expr *)psVar22);
            }
LAB_00182b6e:
            sVar49 = 0;
            bVar54 = false;
          }
          if (!bVar54) {
            bVar54 = false;
            goto LAB_00182c5f;
          }
        }
        uVar41 = ((Expr *)psVar22->mutex)->flags;
        if (((((Expr *)psVar22->pDfltColl)->flags ^ uVar41) >> 8 & 1) == 0) {
          if ((uVar41 >> 8 & 1) == 0) {
            pCVar23 = sqlite3ExprCollSeq(pParse,(Expr *)psVar22->pDfltColl);
            if (pCVar23 != (CollSeq *)0x0) {
              puVar1 = &((Expr *)psVar22->pDfltColl)->flags;
              *puVar1 = *puVar1 | 0x100;
            }
          }
          else {
            ((Expr *)psVar22->mutex)->flags = uVar41 & 0xfffffeff;
          }
        }
        pEVar25 = (Expr *)psVar22->mutex;
        psVar22->mutex = (sqlite3_mutex *)psVar22->pDfltColl;
        psVar22->pDfltColl = (CollSeq *)pEVar25;
        if (0x35 < *(byte *)&psVar22->pVfs) {
          *(byte *)&psVar22->pVfs = (*(byte *)&psVar22->pVfs - 0x36 ^ 2) + 0x36;
        }
        pWVar47->leftCursor = (int)local_58.z;
        (pWVar47->u).leftColumn = local_58.z._4_4_;
        pWVar47->prereqRight = BVar19 | local_40;
        pWVar47->prereqAll = (Bitmask)psVar21;
        uVar51 = *(u8 *)&psVar22->pVfs;
        if (uVar51 == '-') {
          sVar14 = 0x80;
        }
        else if (uVar51 == '1') {
          sVar14 = 1;
        }
        else if (uVar51 == '2') {
          sVar14 = 0x100;
        }
        else {
          sVar14 = (short)(2 << (uVar51 - 0x35 & 0x1f));
        }
        pWVar47->eOperator = uVar40 & sVar49 + sVar14;
      }
      bVar54 = true;
    }
LAB_00182c5f:
    local_b0 = psVar21;
    if (!bVar54) {
      return;
    }
  }
  else if (*(u8 *)&pIn->pVfs == '+') {
    pWVar5 = pWC->pWInfo;
    pWVar44 = pWC->a;
    pParse_00 = pWVar5->pParse;
    psVar52 = pParse_00->db;
    local_48 = pWVar44[idxTerm].pExpr;
    pWC_00 = (WhereOrInfo *)sqlite3DbMallocZero(psVar52,0x230);
    pWVar44[idxTerm].u.pOrInfo = pWC_00;
    psVar22 = psVar52;
    if (pWC_00 != (WhereOrInfo *)0x0) {
      psVar21 = (sqlite3_vfs *)(pWVar44 + idxTerm);
      pbVar26 = (byte *)((long)&psVar21->pNext + 2);
      *pbVar26 = *pbVar26 | 0x10;
      pWVar44 = (pWC_00->wc).aStatic;
      memset(pWVar44,0,0x200);
      (pWC_00->wc).pWInfo = pWVar5;
      (pWC_00->wc).hasOr = '\0';
      (pWC_00->wc).pOuter = (WhereClause *)0x0;
      (pWC_00->wc).nTerm = 0;
      (pWC_00->wc).nSlot = 8;
      (pWC_00->wc).a = pWVar44;
      sqlite3WhereSplit((WhereClause *)pWC_00,local_48,'+');
      iVar15 = (pWC_00->wc).nTerm;
      if (0 < iVar15) {
        iVar15 = iVar15 + 1;
        do {
          exprAnalyze(pSrc,(WhereClause *)pWC_00,iVar15 + -2);
          iVar15 = iVar15 + -1;
        } while (1 < iVar15);
      }
      if (psVar52->mallocFailed == '\0') {
        iVar15 = (pWC_00->wc).nTerm;
        if (iVar15 < 1) {
          bVar54 = true;
          BVar19 = 0xffffffffffffffff;
          local_c8 = 0xffffffffffffffff;
        }
        else {
          pWVar44 = (pWC_00->wc).a;
          local_c8 = 0xffffffffffffffff;
          BVar19 = 0xffffffffffffffff;
          do {
            if ((pWVar44->eOperator & 0x1ff) == 0) {
              pWC_01 = (WhereOrInfo *)sqlite3DbMallocRawNN(psVar52,0x228);
              if (pWC_01 == (WhereOrInfo *)0x0) {
                local_c8 = 0;
              }
              else {
                (pWVar44->u).pOrInfo = pWC_01;
                *(byte *)&pWVar44->wtFlags = (byte)pWVar44->wtFlags | 0x20;
                pWVar44->eOperator = 0x400;
                pWVar47 = (pWC_01->wc).aStatic;
                memset(pWVar47,0,0x200);
                (pWC_01->wc).pWInfo = pWC->pWInfo;
                (pWC_01->wc).hasOr = '\0';
                (pWC_01->wc).pOuter = (WhereClause *)0x0;
                (pWC_01->wc).nTerm = 0;
                (pWC_01->wc).nSlot = 8;
                (pWC_01->wc).a = pWVar47;
                sqlite3WhereSplit((WhereClause *)pWC_01,pWVar44->pExpr,',');
                iVar16 = (pWC_01->wc).nTerm;
                if (0 < iVar16) {
                  iVar16 = iVar16 + 1;
                  do {
                    exprAnalyze(pSrc,(WhereClause *)pWC_01,iVar16 + -2);
                    iVar16 = iVar16 + -1;
                  } while (1 < iVar16);
                }
                (pWC_01->wc).pOuter = pWC;
                if ((psVar52->mallocFailed == '\0') && (iVar16 = (pWC_01->wc).nTerm, 0 < iVar16)) {
                  pWVar47 = (pWC_01->wc).a;
                  iVar18 = 0;
                  uVar30 = 0;
                  do {
                    uVar48 = (ulong)pWVar47->pExpr->op;
                    if (((uVar48 < 0x3a) && ((0x3e6200000000000U >> (uVar48 & 0x3f) & 1) != 0)) ||
                       (pWVar47->eOperator == 0x40)) {
                      lVar38 = (long)(pWVar5->sMaskSet).n;
                      if (0 < lVar38) {
                        lVar37 = 0;
                        do {
                          if ((pWVar5->sMaskSet).ix[lVar37] == pWVar47->leftCursor) {
                            uVar48 = 1L << ((byte)lVar37 & 0x3f);
                            goto LAB_001832db;
                          }
                          lVar37 = lVar37 + 1;
                        } while (lVar38 != lVar37);
                      }
                      uVar48 = 0;
LAB_001832db:
                      uVar30 = uVar30 | uVar48;
                    }
                    iVar18 = iVar18 + 1;
                    pWVar47 = pWVar47 + 1;
                  } while (iVar18 != iVar16);
                }
                else {
                  uVar30 = 0;
                }
                BVar19 = BVar19 & uVar30;
                local_c8 = 0;
              }
            }
            else if ((pWVar44->wtFlags & 8) == 0) {
              iVar16 = (pWVar5->sMaskSet).n;
              lVar38 = (long)iVar16;
              if (0 < lVar38) {
                lVar37 = 0;
                do {
                  if ((pWVar5->sMaskSet).ix[lVar37] == pWVar44->leftCursor) {
                    uVar30 = 1L << ((byte)lVar37 & 0x3f);
                    goto LAB_00183233;
                  }
                  lVar37 = lVar37 + 1;
                } while (lVar38 != lVar37);
              }
              uVar30 = 0;
LAB_00183233:
              if ((pWVar44->wtFlags & 2) != 0) {
                if (0 < iVar16) {
                  lVar37 = 0;
                  do {
                    if ((pWVar5->sMaskSet).ix[lVar37] == (pWC_00->wc).a[pWVar44->iParent].leftCursor
                       ) {
                      uVar48 = 1L << ((byte)lVar37 & 0x3f);
                      goto LAB_001832fe;
                    }
                    lVar37 = lVar37 + 1;
                  } while (lVar38 != lVar37);
                }
                uVar48 = 0;
LAB_001832fe:
                uVar30 = uVar30 | uVar48;
              }
              BVar19 = BVar19 & uVar30;
              local_c8 = local_c8 & uVar30;
              if ((pWVar44->eOperator & 2) == 0) {
                local_c8 = 0;
              }
            }
            bVar54 = BVar19 != 0;
            if (iVar15 < 2) break;
            iVar15 = iVar15 + -1;
            pWVar44 = pWVar44 + 1;
          } while (BVar19 != 0);
        }
        pWC_00->indexable = BVar19;
        *(undefined2 *)((long)&psVar21->pNext + 4) = 0x200;
        if ((bVar54) && (pWC->hasOr = '\x01', (pWC_00->wc).nTerm == 2)) {
          lVar38 = 0;
          while( true ) {
            psVar22 = (sqlite3 *)(pWC_00->wc).a;
            if (*(short *)((long)&psVar22->pDfltColl + 4) == 0x400) {
              if (lVar38 < *(int *)(*(long *)&psVar22->nDb + 0x14)) {
                psVar22 = (sqlite3 *)(lVar38 * 0x40 + *(long *)(*(long *)&psVar22->nDb + 0x20));
              }
              else {
                psVar22 = (sqlite3 *)0x0;
              }
            }
            else if (lVar38 != 0) {
              psVar22 = (sqlite3 *)0x0;
            }
            if (psVar22 == (sqlite3 *)0x0) break;
            lVar38 = lVar38 + 1;
            lVar37 = 0;
            while( true ) {
              pWVar44 = (pWC_00->wc).a;
              if (pWVar44[1].eOperator == 0x400) {
                if (lVar37 < ((pWVar44[1].u.pOrInfo)->wc).nTerm) {
                  pWVar44 = ((pWVar44[1].u.pOrInfo)->wc).a + lVar37;
                }
                else {
                  pWVar44 = (WhereTerm *)0x0;
                }
              }
              else {
                pWVar44 = pWVar44 + 1;
                if (lVar37 != 0) {
                  pWVar44 = (WhereTerm *)0x0;
                }
              }
              if (pWVar44 == (WhereTerm *)0x0) break;
              lVar37 = lVar37 + 1;
              uVar40 = *(ushort *)((long)&psVar22->pDfltColl + 4);
              if ((((uVar40 & 0x3e) != 0) && ((pWVar44->eOperator & 0x3e) != 0)) &&
                 ((uVar40 = pWVar44->eOperator | uVar40,
                  (uVar40 & 0xffe5) == 0 || (uVar40 & 0xffd9) == 0 &&
                  ((iVar15 = sqlite3ExprCompare((Parse *)0x0,(Expr *)psVar22->pVfs->pNext,
                                                pWVar44->pExpr->pLeft,-1), iVar15 == 0 &&
                   (iVar15 = sqlite3ExprCompare((Parse *)0x0,(Expr *)psVar22->pVfs->zName,
                                                pWVar44->pExpr->pRight,-1), iVar15 == 0)))))) {
                uVar35 = 8;
                if ((uVar40 & 0x18) == 0) {
                  uVar35 = 0x20;
                }
                if ((uVar40 + 0x3f & uVar40) != 0) {
                  uVar40 = uVar35;
                }
                if (psVar22->pVfs == (sqlite3_vfs *)0x0) {
                  pEVar25 = (Expr *)0x0;
                }
                else {
                  pEVar25 = exprDup(pWC->pWInfo->pParse->db,(Expr *)psVar22->pVfs,0,(u8 **)0x0);
                }
                if (pEVar25 != (Expr *)0x0) {
                  bVar12 = 0;
                  do {
                    bVar34 = bVar12;
                    bVar12 = bVar34 + 1;
                  } while (2 << (bVar34 & 0x1f) != (uint)uVar40);
                  pEVar25->op = bVar34 + 0x35;
                  iVar15 = whereClauseInsert(pWC,pEVar25,3);
                  exprAnalyze(pSrc,pWC,iVar15);
                }
              }
            }
          }
        }
        local_b0 = psVar21;
        if (local_c8 != 0) {
          iVar18 = -1;
          iVar15 = -1;
          bVar54 = false;
          iVar16 = 0;
          do {
            psVar22 = (sqlite3 *)(pWC_00->wc).a;
            iVar17 = (pWC_00->wc).nTerm;
            iVar42 = iVar17 + -1;
            if (0 < iVar17) {
              do {
                pbVar26 = (byte *)((long)&psVar22->pDfltColl + 2);
                *pbVar26 = *pbVar26 & 0xbf;
                iVar17 = *(int *)((long)&psVar22->mutex + 4);
                if (iVar17 != iVar18) {
                  lVar38 = (long)(pWVar5->sMaskSet).n;
                  if (0 < lVar38) {
                    lVar37 = 0;
                    do {
                      if ((pWVar5->sMaskSet).ix[lVar37] == iVar17) {
                        uVar30 = 1L << ((byte)lVar37 & 0x3f);
                        goto LAB_00183a98;
                      }
                      lVar37 = lVar37 + 1;
                    } while (lVar38 != lVar37);
                  }
                  uVar30 = 0;
LAB_00183a98:
                  if ((local_c8 & uVar30) != 0) {
                    iVar15 = psVar22->nDb;
                    local_b0 = psVar22->pVfs->pNext;
                    bVar53 = true;
                    iVar18 = iVar17;
                    goto LAB_00183ad5;
                  }
                }
                psVar22 = (sqlite3 *)&psVar22->szMmap;
                bVar53 = 0 < iVar42;
                iVar42 = iVar42 + -1;
              } while (bVar53);
              iVar42 = -1;
            }
            bVar53 = false;
            local_b0 = (sqlite3_vfs *)0x0;
LAB_00183ad5:
            if (bVar53) {
              if (iVar42 < 0) {
                bVar54 = true;
              }
              else {
                do {
                  if (*(int *)((long)&psVar22->mutex + 4) == iVar18) {
                    bVar10 = false;
                    bVar54 = false;
                    if (psVar22->nDb == iVar15) {
                      if (iVar15 == -2) {
                        iVar17 = sqlite3ExprCompare(pParse_00,(Expr *)psVar22->pVfs->pNext,
                                                    (Expr *)local_b0,-1);
                        bVar10 = false;
                        bVar54 = false;
                        if (iVar17 != 0) goto LAB_00183b79;
                      }
                      cVar13 = sqlite3ExprAffinity((Expr *)psVar22->pVfs->zName);
                      cVar11 = sqlite3ExprAffinity((Expr *)psVar22->pVfs->pNext);
                      if (cVar13 != '\0') {
                        bVar10 = false;
                        bVar54 = false;
                        if (cVar13 != cVar11) goto LAB_00183b79;
                      }
                      pbVar26 = (byte *)((long)&psVar22->pDfltColl + 2);
                      *pbVar26 = *pbVar26 | 0x40;
                      goto LAB_00183b72;
                    }
                  }
                  else {
                    pbVar26 = (byte *)((long)&psVar22->pDfltColl + 2);
                    *pbVar26 = *pbVar26 & 0xbf;
LAB_00183b72:
                    bVar54 = true;
                    bVar10 = true;
                  }
LAB_00183b79:
                  if (!bVar10) break;
                  psVar22 = (sqlite3 *)&psVar22->szMmap;
                  bVar10 = 0 < iVar42;
                  iVar42 = iVar42 + -1;
                } while (bVar10);
              }
            }
          } while ((bVar53) && (bVar53 = iVar16 == 0, iVar16 = iVar16 + 1, bVar53 && !bVar54));
          if (bVar54) {
            iVar15 = (pWC_00->wc).nTerm;
            if (iVar15 < 1) {
              pEVar29 = (ExprList *)0x0;
              pEVar25 = (Expr *)0x0;
            }
            else {
              psVar22 = (sqlite3 *)(pWC_00->wc).a;
              iVar15 = iVar15 + 1;
              pEVar25 = (Expr *)0x0;
              pEVar29 = (ExprList *)0x0;
              do {
                if ((((WhereTerm *)psVar22)->wtFlags & 0x40) != 0) {
                  pEVar25 = ((WhereTerm *)psVar22)->pExpr->pRight;
                  if (pEVar25 == (Expr *)0x0) {
                    pEVar25 = (Expr *)0x0;
                  }
                  else {
                    pEVar25 = exprDup(psVar52,pEVar25,0,(u8 **)0x0);
                  }
                  pEVar29 = sqlite3ExprListAppend(pWVar5->pParse,pEVar29,pEVar25);
                  pEVar25 = ((WhereTerm *)psVar22)->pExpr->pLeft;
                }
                psVar22 = (sqlite3 *)((long)psVar22 + 0x40);
                iVar15 = iVar15 + -1;
              } while (1 < iVar15);
            }
            if (pEVar25 == (Expr *)0x0) {
              pEVar25 = (Expr *)0x0;
            }
            else {
              pEVar25 = exprDup(psVar52,pEVar25,0,(u8 **)0x0);
            }
            pEVar25 = sqlite3PExpr(pParse_00,0x31,pEVar25,(Expr *)0x0);
            if (pEVar25 == (Expr *)0x0) {
              if (pEVar29 != (ExprList *)0x0) {
                exprListDeleteNN(psVar52,pEVar29);
              }
            }
            else {
              pEVar25->flags = pEVar25->flags | local_48->flags & 1;
              pEVar25->iRightJoinTable = local_48->iRightJoinTable;
              (pEVar25->x).pList = pEVar29;
              iVar15 = whereClauseInsert(pWC,pEVar25,3);
              exprAnalyze(pSrc,pWC,iVar15);
              pWVar44 = pWC->a;
              pWVar44[iVar15].iParent = idxTerm;
              pWVar44[iVar15].truthProb = pWVar44[idxTerm].truthProb;
              pWVar44[idxTerm].nChild = pWVar44[idxTerm].nChild + '\x01';
            }
          }
        }
      }
    }
    pWVar44 = pWC->a + idxTerm;
  }
  else if ((*(u8 *)&pIn->pVfs == '0') && (pWC->op == ',')) {
    pEVar36 = ((anon_union_8_2_a01b6dbf_for_x *)&pIn->aDb)->pList->a;
    psVar22 = (sqlite3 *)0x0;
    do {
      bVar12 = *(byte *)((long)&psVar22[0xb10].aDbStatic[0].pSchema + 4);
      if ((Expr *)pIn->pDfltColl == (Expr *)0x0) {
        pEVar25 = (Expr *)0x0;
      }
      else {
        pEVar25 = exprDup(db,(Expr *)pIn->pDfltColl,0,(u8 **)0x0);
      }
      if (pEVar36->pExpr == (Expr *)0x0) {
        pEVar28 = (Expr *)0x0;
      }
      else {
        pEVar28 = exprDup(db,pEVar36->pExpr,0,(u8 **)0x0);
      }
      pEVar25 = sqlite3PExpr(pParse,(uint)bVar12,pEVar25,pEVar28);
      if (pEVar25 != (Expr *)0x0) {
        pEVar25->flags = pEVar25->flags | *(u32 *)((long)&pIn->pVfs + 4) & 1;
        pEVar25->iRightJoinTable = *(i16 *)((long)&pIn->flags + 4);
      }
      iVar15 = whereClauseInsert(pWC,pEVar25,3);
      exprAnalyze(pSrc,pWC,iVar15);
      pWVar44 = pWC->a;
      pWVar44[iVar15].iParent = idxTerm;
      pWVar44[iVar15].truthProb = pWVar44[idxTerm].truthProb;
      pWVar44[idxTerm].nChild = pWVar44[idxTerm].nChild + '\x01';
      psVar22 = (sqlite3 *)((long)&psVar22->pVfs + 1);
      pEVar36 = pEVar36 + 1;
    } while (psVar22 == (sqlite3 *)0x1);
    pWVar44 = pWVar44 + idxTerm;
  }
  bVar12 = (byte)psVar22;
  if (pWC->op == ',') {
    psVar22 = pParse->db;
    local_c8._0_1_ = (byte)pParse;
    cVar13 = '\x01';
    bVar54 = true;
    psVar52 = pIn;
    if (*(u8 *)&pIn->pVfs == 0xa1) {
      pFVar24 = (FuncDef *)((anon_union_8_2_a01b6dbf_for_x *)&pIn->aDb)->pList;
      if (pFVar24 == (FuncDef *)0x0) {
LAB_00182e4a:
        cVar13 = '\x01';
        local_c8._0_1_ = (byte)pFVar24;
        bVar54 = true;
      }
      else {
        iVar15 = *(int *)pFVar24;
        pFVar24 = sqlite3FindFunction(psVar22,((anon_union_8_2_443a03b8_for_u *)&pIn->pVdbe)->zToken
                                      ,iVar15,'\x01','\0');
        if (pFVar24 == (FuncDef *)0x0) {
          local_c8._0_1_ = 0;
          cVar13 = '\x01';
          bVar54 = true;
        }
        else {
          cVar13 = '\x01';
          bVar54 = true;
          local_c8._0_1_ = extraout_DL;
          if ((pFVar24->funcFlags & 4) != 0) {
            if (iVar15 < 3) {
              local_c8._0_1_ = 0;
LAB_00182cf4:
              pbVar26 = (byte *)pFVar24->pUserData;
              bVar12 = *pbVar26;
              local_b0._0_1_ = pbVar26[2];
              bVar54 = false;
              cVar13 = (char)((pFVar24->funcFlags & 8) >> 3);
              psVar52 = (sqlite3 *)(ulong)pbVar26[1];
            }
            else {
              pEVar29 = ((anon_union_8_2_a01b6dbf_for_x *)&pIn->aDb)->pSelect->pOrderBy;
              local_c8._0_1_ = (byte)((anon_union_8_2_a01b6dbf_for_x *)&pIn->aDb)->pSelect;
              bVar54 = true;
              if ((char)pEVar29->nExpr == 'n') {
                pEVar25 = pEVar29->a[0].pExpr;
                local_c8._0_1_ = pEVar25->op;
                if ((byte)local_c8 == 0) goto LAB_00182e4a;
                bVar54 = true;
                if (pEVar25->affinity == '\0') goto LAB_00182cf4;
              }
            }
          }
        }
      }
    }
    bVar53 = true;
    if (bVar54) {
      pEVar31 = (Expr *)0x0;
      bVar54 = false;
    }
    else {
      pEVar25 = ((anon_union_8_2_a01b6dbf_for_x *)&pIn->aDb)->pList->a[0].pExpr;
      while ((pEVar25 != (Expr *)0x0 && ((pEVar25->flags >> 0xc & 1) != 0))) {
        if ((pEVar25->flags >> 0x12 & 1) == 0) {
          pEVar36 = (ExprList_item *)&pEVar25->pLeft;
        }
        else {
          pEVar36 = ((pEVar25->x).pList)->a;
        }
        pEVar25 = pEVar36->pExpr;
      }
      pEVar28 = *(Expr **)(((anon_union_8_2_a01b6dbf_for_x *)&pIn->aDb)->pList + 1);
      uVar51 = pEVar25->op;
      if ((uVar51 == 0x94) && ((psVar22->flags & 0x800000) == 0)) {
        sVar49 = pEVar25->iColumn;
        pVal = sqlite3VdbeGetBoundValue(pParse->pReprepare,(int)sVar49,'\0');
        if ((pVal == (sqlite3_value *)0x0) || ((pVal->flags & 0xf) != 2)) {
          pbVar26 = (byte *)0x0;
        }
        else {
          pbVar26 = (byte *)sqlite3ValueText(pVal,'\x01');
        }
        if (sVar49 < 0x20) {
          puVar1 = &pParse->pVdbe->expmask;
          *puVar1 = *puVar1 | 1 << ((char)sVar49 - 1U & 0x1f);
        }
        else {
          pbVar2 = (byte *)((long)&pParse->pVdbe->expmask + 3);
          *pbVar2 = *pbVar2 | 0x80;
        }
      }
      else if (uVar51 == 'n') {
        pbVar26 = (byte *)(pEVar25->u).zToken;
        pVal = (sqlite3_value *)0x0;
      }
      else {
        pVal = (sqlite3_value *)0x0;
        pbVar26 = (byte *)0x0;
      }
      bVar53 = true;
      if (pbVar26 == (byte *)0x0) {
        pEVar31 = (Expr *)0x0;
        bVar54 = false;
      }
      else {
        bVar34 = *pbVar26;
        bVar53 = bVar34 == bVar12;
        if (((bVar34 == 0) || (bVar34 == bVar12)) || (bVar34 == (byte)psVar52)) {
          iVar15 = 0;
          lVar38 = 0;
        }
        else {
          iVar15 = 0;
          lVar38 = 0;
          if (bVar34 != (byte)local_b0) {
            iVar15 = 0;
            do {
              uVar30 = (long)iVar15 + 1;
              if ((bVar34 == (byte)local_c8) && (pbVar26[uVar30] != 0)) {
                uVar30 = (ulong)(iVar15 + 2);
              }
              iVar15 = (int)uVar30;
              lVar38 = (long)iVar15;
              bVar34 = pbVar26[lVar38];
              bVar53 = bVar34 == bVar12;
            } while (((bVar34 != 0) && (bVar34 != bVar12)) &&
                    ((bVar34 != (byte)psVar52 && (bVar34 != (byte)local_b0))));
          }
        }
        if (iVar15 == 0) {
          bVar54 = false;
        }
        else {
          if ((pbVar26[(long)iVar15 + -1] != 0xff) && ((1 < iVar15 || (*pbVar26 != (byte)local_c8)))
             ) {
            bVar54 = false;
            if (bVar53) {
              bVar54 = pbVar26[(long)iVar15 + 1] == 0;
            }
            pEVar31 = sqlite3Expr(psVar22,0x6e,(char *)pbVar26);
            if (pEVar31 != (Expr *)0x0) {
              pbVar26 = (byte *)(pEVar31->u).zToken;
              pbVar26[lVar38] = 0;
              if (iVar15 < 1) {
                uVar30 = 0;
              }
              else {
                uVar30 = 0;
                iVar16 = 0;
                do {
                  bVar12 = pbVar26[iVar16];
                  pbVar26[uVar30] =
                       pbVar26[(int)(iVar16 + (uint)((int)(char)bVar12 == (uint)(byte)local_c8))];
                  uVar30 = uVar30 + 1;
                  iVar16 = iVar16 + (uint)((int)(char)bVar12 == (uint)(byte)local_c8) + 1;
                } while (iVar16 < iVar15);
              }
              pbVar26[uVar30 & 0xffffffff] = 0;
              bVar12 = *pbVar26;
              if ((((ulong)bVar12 - 0x30 < 10 || (ulong)bVar12 == 0x2d) ||
                  ((int)uVar30 == 1 && bVar12 == 0x2f)) &&
                 ((pEVar28->op != 0xa2 ||
                  ((cVar11 = sqlite3ExprAffinity(pEVar28), cVar11 != 'B' ||
                   (((pEVar28->y).pTab)->nModuleArg != 0)))))) {
                sqlite3ExprDeleteNN(psVar22,pEVar31);
                goto LAB_001833c2;
              }
            }
            if (uVar51 == 0x94) {
              pVVar7 = pParse->pVdbe;
              uVar4 = pEVar25->iColumn;
              uVar41 = 0x80000000;
              if ((short)uVar4 < 0x20) {
                uVar41 = 1 << ((char)uVar4 - 1U & 0x1f);
              }
              pVVar7->expmask = pVVar7->expmask | uVar41;
              if ((bVar54) && ((pEVar25->u).zToken[1] != '\0')) {
                if (pParse->nTempReg == '\0') {
                  iVar15 = pParse->nMem + 1;
                  pParse->nMem = iVar15;
                }
                else {
                  bVar12 = pParse->nTempReg - 1;
                  pParse->nTempReg = bVar12;
                  iVar15 = pParse->aTempReg[bVar12];
                }
                sqlite3ExprCodeTarget(pParse,pEVar25,iVar15);
                if (pVVar7->db->mallocFailed == '\0') {
                  pOVar33 = pVVar7->aOp + (long)pVVar7->nOp + -1;
                }
                else {
                  pOVar33 = (Op *)&sqlite3VdbeGetOp_dummy;
                }
                pOVar33->p3 = 0;
                if (iVar15 != 0) {
                  bVar12 = pParse->nTempReg;
                  if ((ulong)bVar12 < 8) {
                    pParse->nTempReg = bVar12 + 1;
                    pParse->aTempReg[bVar12] = iVar15;
                  }
                }
                bVar53 = false;
              }
              else {
                bVar53 = false;
              }
            }
            else {
              bVar53 = false;
            }
            goto LAB_001833c4;
          }
          bVar54 = false;
        }
LAB_001833c2:
        pEVar31 = (Expr *)0x0;
        bVar53 = true;
      }
LAB_001833c4:
      sqlite3ValueFree(pVal);
    }
    if (!bVar53) {
      pSVar46 = ((anon_union_8_2_a01b6dbf_for_x *)&pIn->aDb)->pSelect->pSrc;
      if (pEVar31 == (Expr *)0x0) {
        pEVar25 = (Expr *)0x0;
      }
      else {
        pEVar25 = exprDup(db,pEVar31,0,(u8 **)0x0);
      }
      if ((cVar13 == '\0') && (pParse->db->mallocFailed == '\0')) {
        pbVar26 = (byte *)((long)&pWVar44->wtFlags + 1);
        *pbVar26 = *pbVar26 | 4;
        pbVar26 = (byte *)(pEVar31->u).zToken;
        bVar12 = *pbVar26;
        if (bVar12 != 0) {
          lVar38 = 1;
          do {
            *pbVar26 = bVar12 & (~""[bVar12] | 0xdf);
            (pEVar25->u).zToken[lVar38 + -1] = ""[bVar12];
            bVar12 = (pEVar31->u).zToken[lVar38];
            pbVar26 = (byte *)((pEVar31->u).zToken + lVar38);
            lVar38 = lVar38 + 1;
          } while (bVar12 != 0);
        }
      }
      if (db->mallocFailed == '\0') {
        pcVar43 = (pEVar25->u).zToken;
        if (pcVar43 == (char *)0x0) {
          uVar30 = 0;
        }
        else {
          sVar27 = strlen(pcVar43);
          uVar30 = (ulong)((uint)sVar27 & 0x3fffffff);
        }
        bVar12 = pcVar43[uVar30 - 1];
        if (cVar13 == '\0') {
          if (bVar12 == 0x40) {
            bVar54 = false;
          }
          bVar12 = ""[bVar12];
        }
        pcVar43[uVar30 - 1] = bVar12 + 1;
      }
      pcVar43 = "NOCASE";
      if (cVar13 != '\0') {
        pcVar43 = "BINARY";
      }
      if (pSVar46 == (SrcList *)0x0) {
        pEVar28 = (Expr *)0x0;
      }
      else {
        pEVar28 = exprDup(db,(Expr *)pSVar46,0,(u8 **)0x0);
      }
      local_58.n = 6;
      local_58.z = pcVar43;
      pEVar28 = sqlite3ExprAddCollateToken(pParse,pEVar28,&local_58,0);
      pEVar28 = sqlite3PExpr(pParse,0x39,pEVar28,pEVar31);
      if (pEVar28 != (Expr *)0x0) {
        pEVar28->flags = pEVar28->flags | *(u32 *)((long)&pIn->pVfs + 4) & 1;
        pEVar28->iRightJoinTable = *(i16 *)((long)&pIn->flags + 4);
      }
      iVar15 = whereClauseInsert(pWC,pEVar28,0x103);
      exprAnalyze(pSrc,pWC,iVar15);
      if (pSVar46 == (SrcList *)0x0) {
        pEVar28 = (Expr *)0x0;
      }
      else {
        pEVar28 = exprDup(db,(Expr *)pSVar46,0,(u8 **)0x0);
      }
      local_58.n = 6;
      local_58.z = pcVar43;
      pEVar28 = sqlite3ExprAddCollateToken(pParse,pEVar28,&local_58,0);
      pEVar25 = sqlite3PExpr(pParse,0x38,pEVar28,pEVar25);
      if (pEVar25 != (Expr *)0x0) {
        pEVar25->flags = pEVar25->flags | *(u32 *)((long)&pIn->pVfs + 4) & 1;
        pEVar25->iRightJoinTable = *(i16 *)((long)&pIn->flags + 4);
      }
      iVar16 = whereClauseInsert(pWC,pEVar25,0x103);
      exprAnalyze(pSrc,pWC,iVar16);
      pWVar47 = pWC->a;
      pWVar44 = pWVar47 + idxTerm;
      if (bVar54) {
        pWVar47[iVar15].iParent = idxTerm;
        pWVar47[iVar15].truthProb = pWVar47[idxTerm].truthProb;
        uVar51 = pWVar47[idxTerm].nChild;
        pWVar47[idxTerm].nChild = uVar51 + '\x01';
        pWVar47[iVar16].iParent = idxTerm;
        pWVar47[iVar16].truthProb = pWVar47[idxTerm].truthProb;
        pWVar47[idxTerm].nChild = uVar51 + '\x02';
      }
    }
  }
  if (pWC->op == ',') {
    bVar12 = *(byte *)&pIn->pVfs;
    if ((bVar12 - 0x33 < 2) || (bVar12 == 0xa0)) {
      pSVar46 = (SrcList *)pIn->pDfltColl;
      p = (SrcList *)pIn->mutex;
      uVar41 = 0;
      if ((char)pSVar46->nSrc == -0x5e) {
        uVar41 = (uint)(*(int *)(*(long *)&pSVar46->a[0].regResult + 0x54) != 0);
      }
      uVar51 = '\0';
      pSVar45 = pSVar46;
      if (p == (SrcList *)0x0) {
        p = (SrcList *)0x0;
      }
      else if (((char)p->nSrc == -0x5e) && (*(int *)(*(long *)&p->a[0].regResult + 0x54) != 0)) {
        uVar41 = uVar41 + 1;
        pSVar45 = p;
        p = pSVar46;
      }
      if (bVar12 == 0x34) {
        uVar51 = 'D';
      }
      uVar39 = 'E';
      if (bVar12 != 0xa0) {
        uVar39 = uVar51;
      }
      uVar51 = 'F';
      if (bVar12 != 0x33) {
        uVar51 = uVar39;
      }
    }
    else {
      if (((bVar12 == 0xa1) &&
          (pSVar32 = ((anon_union_8_2_a01b6dbf_for_x *)&pIn->aDb)->pSelect, pSVar32 != (Select *)0x0
          )) && (*(int *)&pSVar32->pEList == 2)) {
        pSVar45 = pSVar32->pSrc;
        if (((char)pSVar45->nSrc == -0x5e) &&
           (*(int *)(*(long *)&pSVar45->a[0].regResult + 0x54) != 0)) {
          pcVar43 = ((anon_union_8_2_443a03b8_for_u *)&pIn->pVdbe)->zToken;
          lVar38 = 0;
          do {
            iVar15 = sqlite3StrICmp(pcVar43,*(char **)((long)&isAuxiliaryVtabOperator_aOp + lVar38))
            ;
            if (iVar15 == 0) {
              uVar51 = (&DAT_0020ccb8)[lVar38];
              p = *(SrcList **)&pSVar32->op;
              goto LAB_00183c71;
            }
            lVar38 = lVar38 + 0x10;
          } while (lVar38 != 0x40);
        }
        pSVar45 = *(SrcList **)&pSVar32->op;
        if (((char)pSVar45->nSrc == -0x5e) &&
           (lVar38 = *(long *)&pSVar45->a[0].regResult, *(int *)(lVar38 + 0x54) != 0)) {
          for (puVar6 = *(undefined8 **)(lVar38 + 0x60);
              (puVar6 != (undefined8 *)0x0 && ((sqlite3 *)*puVar6 != db));
              puVar6 = (undefined8 *)puVar6[5]) {
          }
          pcVar8 = *(code **)(*(long *)puVar6[2] + 0x90);
          if ((pcVar8 != (code *)0x0) &&
             (iVar15 = (*pcVar8)((long *)puVar6[2],2,
                                 ((anon_union_8_2_443a03b8_for_u *)&pIn->pVdbe)->zToken,&local_58,
                                 local_38), 0x95 < iVar15)) {
            uVar51 = (u8)iVar15;
            p = pSVar32->pSrc;
LAB_00183c71:
            uVar41 = 1;
            goto LAB_00183c82;
          }
        }
      }
      p = (SrcList *)0x0;
      pSVar45 = (SrcList *)0x0;
      uVar41 = 0;
      uVar51 = '\0';
    }
LAB_00183c82:
    if (uVar41 != 0) {
      iVar15 = uVar41 + 1;
      do {
        pSVar46 = pSVar45;
        if (p == (SrcList *)0x0) {
          BVar19 = 0;
        }
        else {
          BVar19 = sqlite3WhereExprUsageNN(pMaskSet,(Expr *)p);
        }
        if (pSVar46 == (SrcList *)0x0) {
          uVar30 = 0;
        }
        else {
          uVar30 = sqlite3WhereExprUsageNN(pMaskSet,(Expr *)pSVar46);
        }
        if ((uVar30 & BVar19) == 0) {
          if (p == (SrcList *)0x0) {
            pEVar25 = (Expr *)0x0;
          }
          else {
            pEVar25 = exprDup(db,(Expr *)p,0,(u8 **)0x0);
          }
          pEVar25 = sqlite3PExpr(pParse,0x2e,(Expr *)0x0,pEVar25);
          if ((((ulong)pIn->pVfs & 0x100000000) != 0) && (pEVar25 != (Expr *)0x0)) {
            *(byte *)&pEVar25->flags = (byte)pEVar25->flags | 1;
          }
          iVar16 = whereClauseInsert(pWC,pEVar25,3);
          pWVar47 = pWC->a;
          pWVar47[iVar16].prereqRight = BVar19;
          pWVar47[iVar16].leftCursor = *(int *)((long)&pSVar46->a[0].pTab + 4);
          *(int *)&pWVar47[iVar16].u = (int)*(short *)&pSVar46->a[0].pSelect;
          pWVar47[iVar16].eOperator = 0x40;
          pWVar47[iVar16].eMatchOp = uVar51;
          pWVar9 = pWC->a;
          pWVar9[iVar16].iParent = idxTerm;
          pWVar9[iVar16].truthProb = pWVar9[idxTerm].truthProb;
          pWVar9[idxTerm].nChild = pWVar9[idxTerm].nChild + '\x01';
          *(byte *)&pWVar9[idxTerm].wtFlags = (byte)pWVar9[idxTerm].wtFlags | 8;
          pWVar44 = pWVar9 + idxTerm;
          pWVar47[iVar16].prereqAll = pWVar9[idxTerm].prereqAll;
        }
        iVar15 = iVar15 + -1;
        pSVar45 = p;
        p = pSVar46;
      } while (1 < iVar15);
    }
  }
  if ((pWC->op != ',') || ((*(u8 *)&pIn->pVfs != '5' && (*(u8 *)&pIn->pVfs != '-'))))
  goto LAB_00183f0a;
  pEVar25 = (Expr *)pIn->pDfltColl;
  uVar51 = pEVar25->op;
  if (uVar51 == 0xa8) {
    uVar51 = pEVar25->op2;
  }
  if (uVar51 == 0x83) {
    pSVar32 = (pEVar25->x).pSelect;
LAB_00183dfd:
    iVar15 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar32->pEList)->pList->nExpr;
  }
  else {
    iVar15 = 1;
    if (uVar51 == 0xa9) {
      pSVar32 = (Select *)&pEVar25->x;
      goto LAB_00183dfd;
    }
  }
  if (iVar15 < 2) goto LAB_00183f0a;
  pEVar28 = (Expr *)pIn->mutex;
  uVar51 = pEVar28->op;
  if (uVar51 == 0xa8) {
    uVar51 = pEVar28->op2;
  }
  if (uVar51 == 0x83) {
    pSVar32 = (pEVar28->x).pSelect;
LAB_00183e3d:
    iVar16 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar32->pEList)->pList->nExpr;
  }
  else {
    iVar16 = 1;
    if (uVar51 == 0xa9) {
      pSVar32 = (Select *)&pEVar28->x;
      goto LAB_00183e3d;
    }
  }
  if ((iVar16 == iVar15) && (((pEVar25->flags & 0x800) == 0 || ((pEVar28->flags & 0x800) == 0)))) {
    if (iVar15 < 2) {
      iVar15 = 1;
    }
    iVar16 = 0;
    do {
      pEVar25 = sqlite3ExprForVectorField(pParse,(Expr *)pIn->pDfltColl,iVar16);
      pEVar28 = sqlite3ExprForVectorField(pParse,(Expr *)pIn->mutex,iVar16);
      pEVar25 = sqlite3PExpr(pParse,(uint)*(byte *)&pIn->pVfs,pEVar25,pEVar28);
      if (pEVar25 != (Expr *)0x0) {
        pEVar25->flags = pEVar25->flags | *(u32 *)((long)&pIn->pVfs + 4) & 1;
        pEVar25->iRightJoinTable = *(i16 *)((long)&pIn->flags + 4);
      }
      iVar18 = whereClauseInsert(pWC,pEVar25,1);
      exprAnalyze(pSrc,pWC,iVar18);
      iVar16 = iVar16 + 1;
    } while (iVar15 != iVar16);
    pWVar47 = pWC->a;
    pWVar44 = pWVar47 + idxTerm;
    pWVar47[idxTerm].wtFlags = pWVar47[idxTerm].wtFlags | 6;
    pWVar47[idxTerm].eOperator = 0;
  }
LAB_00183f0a:
  if ((((pWC->op == ',') && (*(u8 *)&pIn->pVfs == '1')) && (pWVar44->iField == 0)) &&
     ((((Expr *)pIn->pDfltColl)->op == 0xa9 &&
      (((anon_union_8_2_a01b6dbf_for_x *)&pIn->aDb)->pSelect->pPrior == (Select *)0x0)))) {
    iVar15 = 1;
    do {
      pEVar25 = (Expr *)pIn->pDfltColl;
      uVar51 = pEVar25->op;
      if (uVar51 == 0xa8) {
        uVar51 = pEVar25->op2;
      }
      if (uVar51 == 0x83) {
        pSVar32 = (pEVar25->x).pSelect;
LAB_001840a7:
        iVar16 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar32->pEList)->pList->nExpr;
      }
      else {
        iVar16 = 1;
        if (uVar51 == 0xa9) {
          pSVar32 = (Select *)&pEVar25->x;
          goto LAB_001840a7;
        }
      }
      if (iVar16 <= iVar15 + -1) break;
      iVar16 = whereClauseInsert(pWC,(Expr *)pIn,2);
      pWC->a[iVar16].iField = iVar15;
      exprAnalyze(pSrc,pWC,iVar16);
      pWVar44 = pWC->a;
      pWVar44[iVar16].iParent = idxTerm;
      pWVar44[iVar16].truthProb = pWVar44[idxTerm].truthProb;
      pWVar44[idxTerm].nChild = pWVar44[idxTerm].nChild + '\x01';
      iVar15 = iVar15 + 1;
    } while( true );
  }
  uVar30 = local_40;
  if (((*(u8 *)&pIn->pVfs == '3') && (pEVar25 = (Expr *)pIn->pDfltColl, pEVar25->op == 0xa2)) &&
     ((-1 < pEVar25->iColumn &&
      ((((ulong)pIn->pVfs & 0x100000000) == 0 && ((db->dbOptFlags & 0x800) == 0)))))) {
    pEVar28 = exprDup(db,pEVar25,0,(u8 **)0x0);
    pEVar31 = (Expr *)sqlite3DbMallocRawNN(db,0x48);
    if (pEVar31 != (Expr *)0x0) {
      pEVar31->op = '\0';
      pEVar31->affinity = '\0';
      *(undefined2 *)&pEVar31->field_0x2 = 0;
      pEVar31->flags = 0;
      (pEVar31->u).zToken = (char *)0x0;
      pEVar31->iColumn = 0;
      pEVar31->iAgg = 0;
      pEVar31->iRightJoinTable = 0;
      pEVar31->op2 = '\0';
      pEVar31->field_0x37 = 0;
      pEVar31->pAggInfo = (AggInfo *)0x0;
      (pEVar31->x).pList = (ExprList *)0x0;
      pEVar31->nHeight = 0;
      pEVar31->iTable = 0;
      pEVar31->pLeft = (Expr *)0x0;
      pEVar31->pRight = (Expr *)0x0;
      (pEVar31->y).pTab = (Table *)0x0;
      pEVar31->op = 'r';
      pEVar31->iAgg = -1;
      pEVar31->nHeight = 1;
    }
    pEVar28 = sqlite3PExpr(pParse,0x36,pEVar28,pEVar31);
    iVar15 = whereClauseInsert(pWC,pEVar28,0x83);
    if (iVar15 != 0) {
      pWVar44 = pWC->a;
      pWVar44[iVar15].prereqRight = 0;
      pWVar44[iVar15].leftCursor = pEVar25->iTable;
      *(int *)&pWVar44[iVar15].u = (int)pEVar25->iColumn;
      pWVar44[iVar15].eOperator = 4;
      pWVar47 = pWC->a;
      pWVar47[iVar15].iParent = idxTerm;
      pWVar47[iVar15].truthProb = pWVar47[idxTerm].truthProb;
      pWVar47[idxTerm].nChild = pWVar47[idxTerm].nChild + '\x01';
      *(byte *)&pWVar47[idxTerm].wtFlags = (byte)pWVar47[idxTerm].wtFlags | 8;
      pWVar44[iVar15].prereqAll = pWVar47[idxTerm].prereqAll;
    }
  }
  pBVar3 = &pWC->a[idxTerm].prereqRight;
  *pBVar3 = *pBVar3 | uVar30;
  return;
}

Assistant:

static void exprAnalyze(
  SrcList *pSrc,            /* the FROM clause */
  WhereClause *pWC,         /* the WHERE clause */
  int idxTerm               /* Index of the term to be analyzed */
){
  WhereInfo *pWInfo = pWC->pWInfo; /* WHERE clause processing context */
  WhereTerm *pTerm;                /* The term to be analyzed */
  WhereMaskSet *pMaskSet;          /* Set of table index masks */
  Expr *pExpr;                     /* The expression to be analyzed */
  Bitmask prereqLeft;              /* Prerequesites of the pExpr->pLeft */
  Bitmask prereqAll;               /* Prerequesites of pExpr */
  Bitmask extraRight = 0;          /* Extra dependencies on LEFT JOIN */
  Expr *pStr1 = 0;                 /* RHS of LIKE/GLOB operator */
  int isComplete = 0;              /* RHS of LIKE/GLOB ends with wildcard */
  int noCase = 0;                  /* uppercase equivalent to lowercase */
  int op;                          /* Top-level operator.  pExpr->op */
  Parse *pParse = pWInfo->pParse;  /* Parsing context */
  sqlite3 *db = pParse->db;        /* Database connection */
  unsigned char eOp2 = 0;          /* op2 value for LIKE/REGEXP/GLOB */
  int nLeft;                       /* Number of elements on left side vector */

  if( db->mallocFailed ){
    return;
  }
  pTerm = &pWC->a[idxTerm];
  pMaskSet = &pWInfo->sMaskSet;
  pExpr = pTerm->pExpr;
  assert( pExpr->op!=TK_AS && pExpr->op!=TK_COLLATE );
  prereqLeft = sqlite3WhereExprUsage(pMaskSet, pExpr->pLeft);
  op = pExpr->op;
  if( op==TK_IN ){
    assert( pExpr->pRight==0 );
    if( sqlite3ExprCheckIN(pParse, pExpr) ) return;
    if( ExprHasProperty(pExpr, EP_xIsSelect) ){
      pTerm->prereqRight = exprSelectUsage(pMaskSet, pExpr->x.pSelect);
    }else{
      pTerm->prereqRight = sqlite3WhereExprListUsage(pMaskSet, pExpr->x.pList);
    }
  }else if( op==TK_ISNULL ){
    pTerm->prereqRight = 0;
  }else{
    pTerm->prereqRight = sqlite3WhereExprUsage(pMaskSet, pExpr->pRight);
  }
  pMaskSet->bVarSelect = 0;
  prereqAll = sqlite3WhereExprUsageNN(pMaskSet, pExpr);
  if( pMaskSet->bVarSelect ) pTerm->wtFlags |= TERM_VARSELECT;
  if( ExprHasProperty(pExpr, EP_FromJoin) ){
    Bitmask x = sqlite3WhereGetMask(pMaskSet, pExpr->iRightJoinTable);
    prereqAll |= x;
    extraRight = x-1;  /* ON clause terms may not be used with an index
                       ** on left table of a LEFT JOIN.  Ticket #3015 */
    if( (prereqAll>>1)>=x ){
      sqlite3ErrorMsg(pParse, "ON clause references tables to its right");
      return;
    }
  }
  pTerm->prereqAll = prereqAll;
  pTerm->leftCursor = -1;
  pTerm->iParent = -1;
  pTerm->eOperator = 0;
  if( allowedOp(op) ){
    int aiCurCol[2];
    Expr *pLeft = sqlite3ExprSkipCollate(pExpr->pLeft);
    Expr *pRight = sqlite3ExprSkipCollate(pExpr->pRight);
    u16 opMask = (pTerm->prereqRight & prereqLeft)==0 ? WO_ALL : WO_EQUIV;

    if( pTerm->iField>0 ){
      assert( op==TK_IN );
      assert( pLeft->op==TK_VECTOR );
      pLeft = pLeft->x.pList->a[pTerm->iField-1].pExpr;
    }

    if( exprMightBeIndexed(pSrc, prereqLeft, aiCurCol, pLeft, op) ){
      pTerm->leftCursor = aiCurCol[0];
      pTerm->u.leftColumn = aiCurCol[1];
      pTerm->eOperator = operatorMask(op) & opMask;
    }
    if( op==TK_IS ) pTerm->wtFlags |= TERM_IS;
    if( pRight 
     && exprMightBeIndexed(pSrc, pTerm->prereqRight, aiCurCol, pRight, op)
    ){
      WhereTerm *pNew;
      Expr *pDup;
      u16 eExtraOp = 0;        /* Extra bits for pNew->eOperator */
      assert( pTerm->iField==0 );
      if( pTerm->leftCursor>=0 ){
        int idxNew;
        pDup = sqlite3ExprDup(db, pExpr, 0);
        if( db->mallocFailed ){
          sqlite3ExprDelete(db, pDup);
          return;
        }
        idxNew = whereClauseInsert(pWC, pDup, TERM_VIRTUAL|TERM_DYNAMIC);
        if( idxNew==0 ) return;
        pNew = &pWC->a[idxNew];
        markTermAsChild(pWC, idxNew, idxTerm);
        if( op==TK_IS ) pNew->wtFlags |= TERM_IS;
        pTerm = &pWC->a[idxTerm];
        pTerm->wtFlags |= TERM_COPIED;

        if( termIsEquivalence(pParse, pDup) ){
          pTerm->eOperator |= WO_EQUIV;
          eExtraOp = WO_EQUIV;
        }
      }else{
        pDup = pExpr;
        pNew = pTerm;
      }
      exprCommute(pParse, pDup);
      pNew->leftCursor = aiCurCol[0];
      pNew->u.leftColumn = aiCurCol[1];
      testcase( (prereqLeft | extraRight) != prereqLeft );
      pNew->prereqRight = prereqLeft | extraRight;
      pNew->prereqAll = prereqAll;
      pNew->eOperator = (operatorMask(pDup->op) + eExtraOp) & opMask;
    }
  }

#ifndef SQLITE_OMIT_BETWEEN_OPTIMIZATION
  /* If a term is the BETWEEN operator, create two new virtual terms
  ** that define the range that the BETWEEN implements.  For example:
  **
  **      a BETWEEN b AND c
  **
  ** is converted into:
  **
  **      (a BETWEEN b AND c) AND (a>=b) AND (a<=c)
  **
  ** The two new terms are added onto the end of the WhereClause object.
  ** The new terms are "dynamic" and are children of the original BETWEEN
  ** term.  That means that if the BETWEEN term is coded, the children are
  ** skipped.  Or, if the children are satisfied by an index, the original
  ** BETWEEN term is skipped.
  */
  else if( pExpr->op==TK_BETWEEN && pWC->op==TK_AND ){
    ExprList *pList = pExpr->x.pList;
    int i;
    static const u8 ops[] = {TK_GE, TK_LE};
    assert( pList!=0 );
    assert( pList->nExpr==2 );
    for(i=0; i<2; i++){
      Expr *pNewExpr;
      int idxNew;
      pNewExpr = sqlite3PExpr(pParse, ops[i], 
                             sqlite3ExprDup(db, pExpr->pLeft, 0),
                             sqlite3ExprDup(db, pList->a[i].pExpr, 0));
      transferJoinMarkings(pNewExpr, pExpr);
      idxNew = whereClauseInsert(pWC, pNewExpr, TERM_VIRTUAL|TERM_DYNAMIC);
      testcase( idxNew==0 );
      exprAnalyze(pSrc, pWC, idxNew);
      pTerm = &pWC->a[idxTerm];
      markTermAsChild(pWC, idxNew, idxTerm);
    }
  }
#endif /* SQLITE_OMIT_BETWEEN_OPTIMIZATION */

#if !defined(SQLITE_OMIT_OR_OPTIMIZATION) && !defined(SQLITE_OMIT_SUBQUERY)
  /* Analyze a term that is composed of two or more subterms connected by
  ** an OR operator.
  */
  else if( pExpr->op==TK_OR ){
    assert( pWC->op==TK_AND );
    exprAnalyzeOrTerm(pSrc, pWC, idxTerm);
    pTerm = &pWC->a[idxTerm];
  }
#endif /* SQLITE_OMIT_OR_OPTIMIZATION */

#ifndef SQLITE_OMIT_LIKE_OPTIMIZATION
  /* Add constraints to reduce the search space on a LIKE or GLOB
  ** operator.
  **
  ** A like pattern of the form "x LIKE 'aBc%'" is changed into constraints
  **
  **          x>='ABC' AND x<'abd' AND x LIKE 'aBc%'
  **
  ** The last character of the prefix "abc" is incremented to form the
  ** termination condition "abd".  If case is not significant (the default
  ** for LIKE) then the lower-bound is made all uppercase and the upper-
  ** bound is made all lowercase so that the bounds also work when comparing
  ** BLOBs.
  */
  if( pWC->op==TK_AND 
   && isLikeOrGlob(pParse, pExpr, &pStr1, &isComplete, &noCase)
  ){
    Expr *pLeft;       /* LHS of LIKE/GLOB operator */
    Expr *pStr2;       /* Copy of pStr1 - RHS of LIKE/GLOB operator */
    Expr *pNewExpr1;
    Expr *pNewExpr2;
    int idxNew1;
    int idxNew2;
    const char *zCollSeqName;     /* Name of collating sequence */
    const u16 wtFlags = TERM_LIKEOPT | TERM_VIRTUAL | TERM_DYNAMIC;

    pLeft = pExpr->x.pList->a[1].pExpr;
    pStr2 = sqlite3ExprDup(db, pStr1, 0);

    /* Convert the lower bound to upper-case and the upper bound to
    ** lower-case (upper-case is less than lower-case in ASCII) so that
    ** the range constraints also work for BLOBs
    */
    if( noCase && !pParse->db->mallocFailed ){
      int i;
      char c;
      pTerm->wtFlags |= TERM_LIKE;
      for(i=0; (c = pStr1->u.zToken[i])!=0; i++){
        pStr1->u.zToken[i] = sqlite3Toupper(c);
        pStr2->u.zToken[i] = sqlite3Tolower(c);
      }
    }

    if( !db->mallocFailed ){
      u8 c, *pC;       /* Last character before the first wildcard */
      pC = (u8*)&pStr2->u.zToken[sqlite3Strlen30(pStr2->u.zToken)-1];
      c = *pC;
      if( noCase ){
        /* The point is to increment the last character before the first
        ** wildcard.  But if we increment '@', that will push it into the
        ** alphabetic range where case conversions will mess up the 
        ** inequality.  To avoid this, make sure to also run the full
        ** LIKE on all candidate expressions by clearing the isComplete flag
        */
        if( c=='A'-1 ) isComplete = 0;
        c = sqlite3UpperToLower[c];
      }
      *pC = c + 1;
    }
    zCollSeqName = noCase ? "NOCASE" : sqlite3StrBINARY;
    pNewExpr1 = sqlite3ExprDup(db, pLeft, 0);
    pNewExpr1 = sqlite3PExpr(pParse, TK_GE,
           sqlite3ExprAddCollateString(pParse,pNewExpr1,zCollSeqName),
           pStr1);
    transferJoinMarkings(pNewExpr1, pExpr);
    idxNew1 = whereClauseInsert(pWC, pNewExpr1, wtFlags);
    testcase( idxNew1==0 );
    exprAnalyze(pSrc, pWC, idxNew1);
    pNewExpr2 = sqlite3ExprDup(db, pLeft, 0);
    pNewExpr2 = sqlite3PExpr(pParse, TK_LT,
           sqlite3ExprAddCollateString(pParse,pNewExpr2,zCollSeqName),
           pStr2);
    transferJoinMarkings(pNewExpr2, pExpr);
    idxNew2 = whereClauseInsert(pWC, pNewExpr2, wtFlags);
    testcase( idxNew2==0 );
    exprAnalyze(pSrc, pWC, idxNew2);
    pTerm = &pWC->a[idxTerm];
    if( isComplete ){
      markTermAsChild(pWC, idxNew1, idxTerm);
      markTermAsChild(pWC, idxNew2, idxTerm);
    }
  }
#endif /* SQLITE_OMIT_LIKE_OPTIMIZATION */

#ifndef SQLITE_OMIT_VIRTUALTABLE
  /* Add a WO_AUX auxiliary term to the constraint set if the
  ** current expression is of the form "column OP expr" where OP
  ** is an operator that gets passed into virtual tables but which is
  ** not normally optimized for ordinary tables.  In other words, OP
  ** is one of MATCH, LIKE, GLOB, REGEXP, !=, IS, IS NOT, or NOT NULL.
  ** This information is used by the xBestIndex methods of
  ** virtual tables.  The native query optimizer does not attempt
  ** to do anything with MATCH functions.
  */
  if( pWC->op==TK_AND ){
    Expr *pRight = 0, *pLeft = 0;
    int res = isAuxiliaryVtabOperator(db, pExpr, &eOp2, &pLeft, &pRight);
    while( res-- > 0 ){
      int idxNew;
      WhereTerm *pNewTerm;
      Bitmask prereqColumn, prereqExpr;

      prereqExpr = sqlite3WhereExprUsage(pMaskSet, pRight);
      prereqColumn = sqlite3WhereExprUsage(pMaskSet, pLeft);
      if( (prereqExpr & prereqColumn)==0 ){
        Expr *pNewExpr;
        pNewExpr = sqlite3PExpr(pParse, TK_MATCH, 
            0, sqlite3ExprDup(db, pRight, 0));
        if( ExprHasProperty(pExpr, EP_FromJoin) && pNewExpr ){
          ExprSetProperty(pNewExpr, EP_FromJoin);
        }
        idxNew = whereClauseInsert(pWC, pNewExpr, TERM_VIRTUAL|TERM_DYNAMIC);
        testcase( idxNew==0 );
        pNewTerm = &pWC->a[idxNew];
        pNewTerm->prereqRight = prereqExpr;
        pNewTerm->leftCursor = pLeft->iTable;
        pNewTerm->u.leftColumn = pLeft->iColumn;
        pNewTerm->eOperator = WO_AUX;
        pNewTerm->eMatchOp = eOp2;
        markTermAsChild(pWC, idxNew, idxTerm);
        pTerm = &pWC->a[idxTerm];
        pTerm->wtFlags |= TERM_COPIED;
        pNewTerm->prereqAll = pTerm->prereqAll;
      }
      SWAP(Expr*, pLeft, pRight);
    }
  }
#endif /* SQLITE_OMIT_VIRTUALTABLE */

  /* If there is a vector == or IS term - e.g. "(a, b) == (?, ?)" - create
  ** new terms for each component comparison - "a = ?" and "b = ?".  The
  ** new terms completely replace the original vector comparison, which is
  ** no longer used.
  **
  ** This is only required if at least one side of the comparison operation
  ** is not a sub-select.  */
  if( pWC->op==TK_AND 
  && (pExpr->op==TK_EQ || pExpr->op==TK_IS)
  && (nLeft = sqlite3ExprVectorSize(pExpr->pLeft))>1
  && sqlite3ExprVectorSize(pExpr->pRight)==nLeft
  && ( (pExpr->pLeft->flags & EP_xIsSelect)==0 
    || (pExpr->pRight->flags & EP_xIsSelect)==0)
  ){
    int i;
    for(i=0; i<nLeft; i++){
      int idxNew;
      Expr *pNew;
      Expr *pLeft = sqlite3ExprForVectorField(pParse, pExpr->pLeft, i);
      Expr *pRight = sqlite3ExprForVectorField(pParse, pExpr->pRight, i);

      pNew = sqlite3PExpr(pParse, pExpr->op, pLeft, pRight);
      transferJoinMarkings(pNew, pExpr);
      idxNew = whereClauseInsert(pWC, pNew, TERM_DYNAMIC);
      exprAnalyze(pSrc, pWC, idxNew);
    }
    pTerm = &pWC->a[idxTerm];
    pTerm->wtFlags |= TERM_CODED|TERM_VIRTUAL;  /* Disable the original */
    pTerm->eOperator = 0;
  }

  /* If there is a vector IN term - e.g. "(a, b) IN (SELECT ...)" - create
  ** a virtual term for each vector component. The expression object
  ** used by each such virtual term is pExpr (the full vector IN(...) 
  ** expression). The WhereTerm.iField variable identifies the index within
  ** the vector on the LHS that the virtual term represents.
  **
  ** This only works if the RHS is a simple SELECT, not a compound
  */
  if( pWC->op==TK_AND && pExpr->op==TK_IN && pTerm->iField==0
   && pExpr->pLeft->op==TK_VECTOR
   && pExpr->x.pSelect->pPrior==0
  ){
    int i;
    for(i=0; i<sqlite3ExprVectorSize(pExpr->pLeft); i++){
      int idxNew;
      idxNew = whereClauseInsert(pWC, pExpr, TERM_VIRTUAL);
      pWC->a[idxNew].iField = i+1;
      exprAnalyze(pSrc, pWC, idxNew);
      markTermAsChild(pWC, idxNew, idxTerm);
    }
  }

#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  /* When sqlite_stat3 histogram data is available an operator of the
  ** form "x IS NOT NULL" can sometimes be evaluated more efficiently
  ** as "x>NULL" if x is not an INTEGER PRIMARY KEY.  So construct a
  ** virtual term of that form.
  **
  ** Note that the virtual term must be tagged with TERM_VNULL.
  */
  if( pExpr->op==TK_NOTNULL
   && pExpr->pLeft->op==TK_COLUMN
   && pExpr->pLeft->iColumn>=0
   && !ExprHasProperty(pExpr, EP_FromJoin)
   && OptimizationEnabled(db, SQLITE_Stat34)
  ){
    Expr *pNewExpr;
    Expr *pLeft = pExpr->pLeft;
    int idxNew;
    WhereTerm *pNewTerm;

    pNewExpr = sqlite3PExpr(pParse, TK_GT,
                            sqlite3ExprDup(db, pLeft, 0),
                            sqlite3ExprAlloc(db, TK_NULL, 0, 0));

    idxNew = whereClauseInsert(pWC, pNewExpr,
                              TERM_VIRTUAL|TERM_DYNAMIC|TERM_VNULL);
    if( idxNew ){
      pNewTerm = &pWC->a[idxNew];
      pNewTerm->prereqRight = 0;
      pNewTerm->leftCursor = pLeft->iTable;
      pNewTerm->u.leftColumn = pLeft->iColumn;
      pNewTerm->eOperator = WO_GT;
      markTermAsChild(pWC, idxNew, idxTerm);
      pTerm = &pWC->a[idxTerm];
      pTerm->wtFlags |= TERM_COPIED;
      pNewTerm->prereqAll = pTerm->prereqAll;
    }
  }
#endif /* SQLITE_ENABLE_STAT3_OR_STAT4 */

  /* Prevent ON clause terms of a LEFT JOIN from being used to drive
  ** an index for tables to the left of the join.
  */
  testcase( pTerm!=&pWC->a[idxTerm] );
  pTerm = &pWC->a[idxTerm];
  pTerm->prereqRight |= extraRight;
}